

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::write<char,fmt::v10::appender>
                   (appender out,char value,format_specs<char> *specs,locale_ref loc)

{
  loc_value value_00;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> out_00;
  bool bVar1;
  write_int_arg<unsigned_int> arg;
  bool local_b9;
  format_specs<char> *specs_local;
  char value_local;
  locale_ref loc_local;
  appender out_local;
  anon_union_16_16_d721ec3a_for_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_1
  local_58;
  undefined8 local_48;
  undefined8 local_40;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_38;
  format_specs<char> *local_30;
  uchar local_21;
  locale_ref local_20;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_18;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_10;
  
  bVar1 = check_char_specs<char>(specs);
  if (bVar1) {
    out_local = write_char<char,fmt::v10::appender>(out,value,specs);
  }
  else {
    local_b9 = false;
    local_30 = specs;
    local_21 = value;
    local_20.locale_ = loc.locale_;
    local_18 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    if ((*(ushort *)&specs->field_0x9 >> 8 & 1) != 0) {
      local_38 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
      loc_value::loc_value<unsigned_char,_0>((loc_value *)&local_58.string,value);
      value_00.value_.value_.field_0.string.size = local_58.string.size;
      value_00.value_.value_.field_0.long_long_value = local_58.long_long_value;
      value_00.value_._16_8_ = local_48;
      value_00.value_._24_8_ = local_40;
      local_b9 = write_loc((appender)local_38.container,value_00,local_30,local_20);
    }
    out_00.container = local_18.container;
    if (local_b9 == false) {
      arg = make_write_int_arg<unsigned_char>
                      (local_21,(sign_t)(*(ushort *)&local_30->field_0x9 >> 4) & 7);
      local_10.container =
           (buffer<char> *)
           write_int_noinline<char,fmt::v10::appender,unsigned_int>
                     (out_00.container,arg,local_30,local_20);
    }
    else {
      local_10.container = local_18.container;
    }
    out_local.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_10.container;
  }
  return (appender)
         out_local.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, Char value,
                         const format_specs<Char>& specs, locale_ref loc = {})
    -> OutputIt {
  // char is formatted as unsigned char for consistency across platforms.
  using unsigned_type =
      conditional_t<std::is_same<Char, char>::value, unsigned char, unsigned>;
  return check_char_specs(specs)
             ? write_char(out, value, specs)
             : write(out, static_cast<unsigned_type>(value), specs, loc);
}